

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaStr.c
# Opt level: O0

Gia_Man_t *
Gia_ManLutBalance(Gia_Man_t *p,int nLutSize,int fUseMuxes,int fRecursive,int fOptArea,int fVerbose)

{
  Tim_Man_t *p_00;
  int iVar1;
  abctime aVar2;
  Tim_Man_t *pTVar3;
  Gia_Man_t *p_01;
  Gia_Man_t *p_02;
  abctime aVar4;
  Tim_Man_t *pTimOld;
  abctime clk;
  Gia_Man_t *pNew;
  Str_Ntk_t *pNtk;
  int fVerbose_local;
  int fOptArea_local;
  int fRecursive_local;
  int fUseMuxes_local;
  int nLutSize_local;
  Gia_Man_t *p_local;
  
  aVar2 = Abc_Clock();
  if (((p->pManTime == (void *)0x0) || (iVar1 = Tim_ManBoxNum((Tim_Man_t *)p->pManTime), iVar1 == 0)
      ) || (iVar1 = Gia_ManIsNormalized(p), iVar1 == 0)) {
    pNew = (Gia_Man_t *)Str_ManNormalize(p);
    clk = (abctime)Str_NtkBalance(p,(Str_Ntk_t *)pNew,nLutSize,fUseMuxes,fRecursive,fOptArea,
                                  fVerbose);
    Gia_ManTransferTiming((Gia_Man_t *)clk,p);
  }
  else {
    p_00 = (Tim_Man_t *)p->pManTime;
    pTVar3 = Tim_ManDup(p_00,0x10);
    p->pManTime = pTVar3;
    p_01 = Gia_ManDupUnnormalize(p);
    if (p_01 == (Gia_Man_t *)0x0) {
      return (Gia_Man_t *)0x0;
    }
    Gia_ManTransferTiming(p_01,p);
    pNew = (Gia_Man_t *)Str_ManNormalize(p_01);
    p_02 = Str_NtkBalance(p_01,(Str_Ntk_t *)pNew,nLutSize,fUseMuxes,fRecursive,fOptArea,fVerbose);
    Gia_ManTransferTiming(p_02,p_01);
    Gia_ManStop(p_01);
    clk = (abctime)Gia_ManDupNormalize(p_02,0);
    Gia_ManTransferTiming((Gia_Man_t *)clk,p_02);
    Gia_ManStop(p_02);
    Tim_ManStop((Tim_Man_t *)((Gia_Man_t *)clk)->pManTime);
    ((Gia_Man_t *)clk)->pManTime = p_00;
    iVar1 = Gia_ManIsNormalized((Gia_Man_t *)clk);
    if (iVar1 == 0) {
      __assert_fail("Gia_ManIsNormalized(pNew)",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaStr.c"
                    ,0x57b,"Gia_Man_t *Gia_ManLutBalance(Gia_Man_t *, int, int, int, int, int)");
    }
  }
  if (fVerbose != 0) {
    aVar4 = Abc_Clock();
    Str_NtkPs((Str_Ntk_t *)pNew,aVar4 - aVar2);
  }
  Str_NtkDelete((Str_Ntk_t *)pNew);
  return (Gia_Man_t *)clk;
}

Assistant:

Gia_Man_t * Gia_ManLutBalance( Gia_Man_t * p, int nLutSize, int fUseMuxes, int fRecursive, int fOptArea, int fVerbose )
{
    Str_Ntk_t * pNtk;
    Gia_Man_t * pNew;
    abctime clk = Abc_Clock();
    if ( p->pManTime && Tim_ManBoxNum((Tim_Man_t*)p->pManTime) && Gia_ManIsNormalized(p) )
    {
        Tim_Man_t * pTimOld = (Tim_Man_t *)p->pManTime;
        p->pManTime = Tim_ManDup( pTimOld, 16 );
        pNew = Gia_ManDupUnnormalize( p );
        if ( pNew == NULL )
            return NULL;
        Gia_ManTransferTiming( pNew, p );
        p = pNew;
        // optimize
        pNtk = Str_ManNormalize( p );
        pNew = Str_NtkBalance( p, pNtk, nLutSize, fUseMuxes, fRecursive, fOptArea, fVerbose );
        Gia_ManTransferTiming( pNew, p );
        Gia_ManStop( p );
        // normalize
        pNew = Gia_ManDupNormalize( p = pNew, 0 );
        Gia_ManTransferTiming( pNew, p );
        Gia_ManStop( p );
        // cleanup
        Tim_ManStop( (Tim_Man_t *)pNew->pManTime );
        pNew->pManTime = pTimOld;
        assert( Gia_ManIsNormalized(pNew) );
    }
    else 
    {
        pNtk = Str_ManNormalize( p );
    //    Str_NtkPrintGroups( pNtk );
        pNew = Str_NtkBalance( p, pNtk, nLutSize, fUseMuxes, fRecursive, fOptArea, fVerbose );
        Gia_ManTransferTiming( pNew, p );
    }
    if ( fVerbose )
        Str_NtkPs( pNtk, Abc_Clock() - clk );
    Str_NtkDelete( pNtk );   
    return pNew;
}